

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeCheckerTester.cpp
# Opt level: O2

void __thiscall psy::C::TypeCheckerTester::case0144(TypeCheckerTester *this)

{
  allocator<char> local_e1;
  string local_e0;
  Expectation local_c0;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,
             "\nvoid _ ( ) {\n    double x [ 1 ] ;\n    int y ;\n    x [ y ] ;\n}\n",&local_e1);
  Expectation::Expectation(&local_c0);
  checkTypes(this,&local_e0,&local_c0);
  Expectation::~Expectation(&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  return;
}

Assistant:

void TypeCheckerTester::case0144()
{
    auto s = R"(
void _ ( ) {
    double x [ 1 ] ;
    int y ;
    x [ y ] ;
}
)";

    checkTypes(s, Expectation());
}